

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  Curl_cfilter *cf;
  curl_trc_feat *pcVar1;
  byte bVar2;
  CURLcode CVar3;
  int iVar4;
  timediff_t timeout_ms;
  uint *puVar5;
  int iVar6;
  Curl_cfilter *cf_00;
  CURLcode CVar7;
  _Bool done;
  _Bool local_4d;
  int local_4c;
  Curl_cfilter *local_48;
  undefined8 local_40;
  void *local_38;
  
  if (data->conn == (connectdata *)0x0) {
    return CURLE_OK;
  }
  cf_00 = data->conn->cfilter[sockindex];
  cf = cf_00;
  while( true ) {
    if (cf == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (cf->cft == &Curl_cft_ssl) break;
    cf = cf->next;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_cft_ssl.log_level)) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, start");
  }
  CVar3 = CURLE_OK;
  local_4c = sockindex;
  Curl_shutdown_start(data,sockindex,(curltime *)0x0);
  if ((cf->field_0x24 & 2) == 0) {
    local_38 = cf->ctx;
    local_40 = *(undefined8 *)((long)local_38 + 0x38);
    *(Curl_easy **)((long)local_38 + 0x38) = data;
    local_4d = false;
    iVar6 = -10;
    local_48 = cf_00;
LAB_0016fc74:
    timeout_ms = Curl_shutdown_timeleft(cf->conn,cf->sockindex,(curltime *)0x0);
    if (timeout_ms < 0) {
      Curl_failf(data,"SSL shutdown timeout");
      CVar3 = CURLE_OPERATION_TIMEDOUT;
      cf_00 = local_48;
      goto LAB_0016fd7b;
    }
    CVar3 = (*Curl_ssl->shut_down)(cf,data,send_shutdown,&local_4d);
    if (CVar3 == CURLE_OK) {
      if (local_4d != false) goto LAB_0016fcdd;
      if (*(int *)((long)local_38 + 0xb4) == 0) {
LAB_0016fcd9:
        iVar6 = iVar6 + 1;
        if (iVar6 == 0) goto LAB_0016fcdd;
        goto LAB_0016fc74;
      }
      iVar4 = Curl_conn_cf_poll(cf,data,timeout_ms);
      if (iVar4 < 0) {
        puVar5 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar5);
        CVar3 = CURLE_RECV_ERROR;
        goto LAB_0016fd56;
      }
      if (iVar4 != 0) {
        if ((local_4d & 1U) == 0) goto LAB_0016fcd9;
        goto LAB_0016fcdd;
      }
      Curl_failf(data,"SSL shutdown timeout");
      CVar3 = CURLE_OPERATION_TIMEDOUT;
    }
LAB_0016fd56:
    *(undefined8 *)((long)cf->ctx + 0x38) = local_40;
    bVar2 = 2;
    goto LAB_0016fd65;
  }
  local_4d = true;
LAB_0016fd7b:
  Curl_shutdown_clear(data,local_4c);
  CVar7 = CURLE_SSL_SHUTDOWN_FAILED;
  if ((local_4d & 1U) != 0) {
    CVar7 = CURLE_OK;
  }
  if (CVar3 != CURLE_OK) {
    CVar7 = CVar3;
  }
  Curl_conn_cf_discard_sub(cf_00,cf,data,false);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"shutdown and remove SSL, done -> %d",(ulong)CVar7);
  }
  return CVar7;
LAB_0016fcdd:
  *(undefined8 *)((long)cf->ctx + 0x38) = local_40;
  bVar2 = local_4d * '\x02';
  CVar3 = CURLE_OK;
LAB_0016fd65:
  cf->field_0x24 = cf->field_0x24 & 0xfd | bVar2;
  cf_00 = local_48;
  goto LAB_0016fd7b;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn ? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}